

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

void gen_VNMUL_dp(TCGContext_conflict1 *tcg_ctx,TCGv_i64 vd,TCGv_i64 vn,TCGv_i64 vm,TCGv_ptr fpst)

{
  TCGTemp *ret;
  TCGTemp *args [3];
  TCGTemp *local_38;
  TCGv_i64 local_30;
  TCGv_ptr local_28;
  
  local_38 = (TCGTemp *)(vn + (long)tcg_ctx);
  local_30 = vm + (long)tcg_ctx;
  local_28 = fpst + (long)tcg_ctx;
  ret = (TCGTemp *)(vd + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_muld_aarch64,ret,3,&local_38);
  local_38 = ret;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_negd_aarch64,ret,1,&local_38);
  return;
}

Assistant:

static void gen_VNMUL_dp(TCGContext *tcg_ctx, TCGv_i64 vd, TCGv_i64 vn, TCGv_i64 vm, TCGv_ptr fpst)
{
    /* VNMUL: -(fn * fm) */
    gen_helper_vfp_muld(tcg_ctx, vd, vn, vm, fpst);
    gen_helper_vfp_negd(tcg_ctx, vd, vd);
}